

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O3

void embree::avx::SphereMiIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  RayHitK<8> *pRVar10;
  Scene *pSVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  float fVar23;
  float fVar30;
  float fVar31;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar32;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  HitK<8> h;
  undefined1 local_360 [16];
  Primitive *local_348;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  Scene *local_2e8;
  undefined1 *local_2e0;
  void *local_2d8;
  RTCRayQueryContext *local_2d0;
  RayHitK<8> *local_2c8;
  undefined1 (*local_2c0) [32];
  undefined4 local_2b8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar11;
  undefined1 auVar42 [64];
  undefined1 auVar44 [64];
  undefined1 auVar48 [64];
  
  pSVar12 = context->scene;
  pGVar5 = (pSVar12->geometries).items[sphere->sharedGeomID].ptr;
  lVar13 = *(long *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar24 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[0] * _Var6);
  auVar19 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[1] * _Var6);
  auVar45 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[2] * _Var6);
  auVar47 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[3] * _Var6);
  auVar33 = vunpcklps_avx(auVar24,auVar45);
  auVar24 = vunpckhps_avx(auVar24,auVar45);
  auVar45 = vunpcklps_avx(auVar19,auVar47);
  auVar19 = vunpckhps_avx(auVar19,auVar47);
  auVar47 = vunpcklps_avx(auVar33,auVar45);
  auVar45 = vunpckhps_avx(auVar33,auVar45);
  auVar17 = vunpcklps_avx(auVar24,auVar19);
  auVar35 = vunpckhps_avx(auVar24,auVar19);
  auVar24 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar19 = vpcmpgtd_avx(auVar24,_DAT_01f7fcf0);
  local_1b0 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar9 = *(undefined4 *)(ray + k * 4);
  auVar40._4_4_ = uVar9;
  auVar40._0_4_ = uVar9;
  auVar40._8_4_ = uVar9;
  auVar40._12_4_ = uVar9;
  auVar47 = vsubps_avx(auVar47,auVar40);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar33._4_4_ = uVar9;
  auVar33._0_4_ = uVar9;
  auVar33._8_4_ = uVar9;
  auVar33._12_4_ = uVar9;
  auVar33 = vsubps_avx(auVar45,auVar33);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar24._4_4_ = uVar9;
  auVar24._0_4_ = uVar9;
  auVar24._8_4_ = uVar9;
  auVar24._12_4_ = uVar9;
  auVar17 = vsubps_avx(auVar17,auVar24);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  auVar53 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  auVar54 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar55 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  auVar24 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar45 = vshufps_avx(auVar24,auVar24,0);
  auVar24 = vrcpps_avx(auVar45);
  fVar23 = auVar24._0_4_;
  auVar25._0_4_ = fVar23 * auVar45._0_4_;
  fVar30 = auVar24._4_4_;
  auVar25._4_4_ = fVar30 * auVar45._4_4_;
  fVar31 = auVar24._8_4_;
  auVar25._8_4_ = fVar31 * auVar45._8_4_;
  fVar32 = auVar24._12_4_;
  auVar25._12_4_ = fVar32 * auVar45._12_4_;
  auVar45._8_4_ = 0x3f800000;
  auVar45._0_8_ = 0x3f8000003f800000;
  auVar45._12_4_ = 0x3f800000;
  auVar24 = vsubps_avx(auVar45,auVar25);
  fVar23 = fVar23 + fVar23 * auVar24._0_4_;
  fVar30 = fVar30 + fVar30 * auVar24._4_4_;
  fVar31 = fVar31 + fVar31 * auVar24._8_4_;
  fVar32 = fVar32 + fVar32 * auVar24._12_4_;
  auVar34._0_4_ = (fVar1 * auVar47._0_4_ + fVar2 * auVar33._0_4_ + fVar3 * auVar17._0_4_) * fVar23;
  auVar34._4_4_ = (fVar1 * auVar47._4_4_ + fVar2 * auVar33._4_4_ + fVar3 * auVar17._4_4_) * fVar30;
  auVar34._8_4_ = (fVar1 * auVar47._8_4_ + fVar2 * auVar33._8_4_ + fVar3 * auVar17._8_4_) * fVar31;
  auVar34._12_4_ =
       (fVar1 * auVar47._12_4_ + fVar2 * auVar33._12_4_ + fVar3 * auVar17._12_4_) * fVar32;
  auVar46._0_4_ = fVar1 * auVar34._0_4_;
  auVar46._4_4_ = fVar1 * auVar34._4_4_;
  auVar46._8_4_ = fVar1 * auVar34._8_4_;
  auVar46._12_4_ = fVar1 * auVar34._12_4_;
  auVar49._0_4_ = fVar2 * auVar34._0_4_;
  auVar49._4_4_ = fVar2 * auVar34._4_4_;
  auVar49._8_4_ = fVar2 * auVar34._8_4_;
  auVar49._12_4_ = fVar2 * auVar34._12_4_;
  auVar51._0_4_ = fVar3 * auVar34._0_4_;
  auVar51._4_4_ = fVar3 * auVar34._4_4_;
  auVar51._8_4_ = fVar3 * auVar34._8_4_;
  auVar51._12_4_ = fVar3 * auVar34._12_4_;
  auVar45 = vsubps_avx(auVar47,auVar46);
  auVar56 = ZEXT1664(auVar45);
  auVar47 = vsubps_avx(auVar33,auVar49);
  auVar50 = ZEXT1664(auVar47);
  auVar33 = vsubps_avx(auVar17,auVar51);
  auVar52 = ZEXT1664(auVar33);
  auVar38._0_4_ =
       auVar45._0_4_ * auVar45._0_4_ + auVar47._0_4_ * auVar47._0_4_ + auVar33._0_4_ * auVar33._0_4_
  ;
  auVar38._4_4_ =
       auVar45._4_4_ * auVar45._4_4_ + auVar47._4_4_ * auVar47._4_4_ + auVar33._4_4_ * auVar33._4_4_
  ;
  auVar38._8_4_ =
       auVar45._8_4_ * auVar45._8_4_ + auVar47._8_4_ * auVar47._8_4_ + auVar33._8_4_ * auVar33._8_4_
  ;
  auVar38._12_4_ =
       auVar45._12_4_ * auVar45._12_4_ +
       auVar47._12_4_ * auVar47._12_4_ + auVar33._12_4_ * auVar33._12_4_;
  auVar16._0_4_ = auVar35._0_4_ * auVar35._0_4_;
  auVar16._4_4_ = auVar35._4_4_ * auVar35._4_4_;
  auVar16._8_4_ = auVar35._8_4_ * auVar35._8_4_;
  auVar16._12_4_ = auVar35._12_4_ * auVar35._12_4_;
  auVar24 = vcmpps_avx(auVar38,auVar16,2);
  auVar17 = auVar19 & auVar24;
  if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar17[0xf] < '\0') {
    auVar24 = vandps_avx(auVar24,auVar19);
    auVar19 = vsubps_avx(auVar16,auVar38);
    auVar17._0_4_ = fVar23 * auVar19._0_4_;
    auVar17._4_4_ = fVar30 * auVar19._4_4_;
    auVar17._8_4_ = fVar31 * auVar19._8_4_;
    auVar17._12_4_ = fVar32 * auVar19._12_4_;
    auVar16 = vsqrtps_avx(auVar17);
    auVar57 = ZEXT1664(auVar16);
    auVar25 = vsubps_avx(auVar34,auVar16);
    auVar41._0_4_ = auVar16._0_4_ + auVar34._0_4_;
    auVar41._4_4_ = auVar16._4_4_ + auVar34._4_4_;
    auVar41._8_4_ = auVar16._8_4_ + auVar34._8_4_;
    auVar41._12_4_ = auVar16._12_4_ + auVar34._12_4_;
    auVar42 = ZEXT1664(auVar41);
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar35._4_4_ = uVar9;
    auVar35._0_4_ = uVar9;
    auVar35._8_4_ = uVar9;
    auVar35._12_4_ = uVar9;
    auVar19 = vcmpps_avx(auVar35,auVar25,2);
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar43._4_4_ = uVar9;
    auVar43._0_4_ = uVar9;
    auVar43._8_4_ = uVar9;
    auVar43._12_4_ = uVar9;
    auVar44 = ZEXT1664(auVar43);
    auVar17 = vcmpps_avx(auVar25,auVar43,2);
    local_2b0 = vandps_avx(auVar17,auVar19);
    auVar19 = vandps_avx(local_2b0,auVar24);
    auVar17 = vcmpps_avx(auVar35,auVar41,2);
    auVar35 = vcmpps_avx(auVar41,auVar43,2);
    auVar17 = vandps_avx(auVar17,auVar35);
    auVar24 = vandps_avx(auVar17,auVar24);
    auVar39 = ZEXT1664(auVar24);
    local_360 = vorps_avx(auVar19,auVar24);
    if ((((local_360 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_360 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_360 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_360[0xf] < '\0') {
      local_2a0 = vblendvps_avx(auVar41,auVar25,auVar19);
      auVar18._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
      auVar18._8_4_ = -auVar16._8_4_;
      auVar18._12_4_ = -auVar16._12_4_;
      auVar24 = vblendvps_avx(auVar16,auVar18,auVar19);
      fVar23 = auVar24._0_4_;
      auVar26._0_4_ = fVar1 * fVar23;
      fVar30 = auVar24._4_4_;
      auVar26._4_4_ = fVar1 * fVar30;
      fVar31 = auVar24._8_4_;
      auVar26._8_4_ = fVar1 * fVar31;
      fVar32 = auVar24._12_4_;
      auVar26._12_4_ = fVar1 * fVar32;
      auVar36._0_4_ = fVar2 * fVar23;
      auVar36._4_4_ = fVar2 * fVar30;
      auVar36._8_4_ = fVar2 * fVar31;
      auVar36._12_4_ = fVar2 * fVar32;
      auVar19._0_4_ = fVar3 * fVar23;
      auVar19._4_4_ = fVar3 * fVar30;
      auVar19._8_4_ = fVar3 * fVar31;
      auVar19._12_4_ = fVar3 * fVar32;
      local_290 = vsubps_avx(auVar26,auVar45);
      local_280 = vsubps_avx(auVar36,auVar47);
      local_270 = vsubps_avx(auVar19,auVar33);
      auVar47._8_4_ = 0x7f800000;
      auVar47._0_8_ = 0x7f8000007f800000;
      auVar47._12_4_ = 0x7f800000;
      auVar48 = ZEXT1664(auVar47);
      local_1e0._0_16_ = local_2a0;
      auVar24 = vblendvps_avx(auVar47,local_2a0,local_360);
      auVar19 = vshufps_avx(auVar24,auVar24,0xb1);
      auVar19 = vminps_avx(auVar19,auVar24);
      auVar45 = vshufpd_avx(auVar19,auVar19,1);
      auVar19 = vminps_avx(auVar45,auVar19);
      auVar19 = vcmpps_avx(auVar24,auVar19,0);
      auVar45 = local_360 & auVar19;
      auVar24 = vpcmpeqd_avx(auVar24,auVar24);
      if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar45[0xf] < '\0'
         ) {
        auVar24 = auVar19;
      }
      auVar24 = vandps_avx(local_360,auVar24);
      uVar7 = vmovmskps_avx(auVar24);
      lVar13 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar7 = 1 << ((byte)k & 0x1f);
      auVar58 = ZEXT864(0) << 0x20;
      local_1a0 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      do {
        auVar24 = auVar39._0_16_;
        auVar19 = auVar50._0_16_;
        auVar47 = auVar53._0_16_;
        local_2c0 = &local_180;
        local_2e0 = local_340;
        auVar45 = auVar52._0_16_;
        auVar35 = auVar56._0_16_;
        auVar17 = auVar55._0_16_;
        auVar33 = auVar54._0_16_;
        auVar16 = auVar57._0_16_;
        uVar4 = *(uint *)(local_1b0 + lVar13 * 4);
        pRVar10 = (RayHitK<8> *)(ulong)uVar4;
        pGVar5 = (pSVar12->geometries).items[(long)pRVar10].ptr;
        local_2c8 = ray;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_360 + lVar13 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            auVar44 = ZEXT464(*(uint *)(local_2a0 + lVar13 * 4));
            *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_2a0 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_290 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_280 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_270 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x200) = 0;
            *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[lVar13];
            *(uint *)(ray + k * 4 + 0x240) = uVar4;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            uVar9 = 0;
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_00dcc55e:
            auVar25 = vshufps_avx(auVar44._0_16_,auVar44._0_16_,0);
            local_2a0 = auVar42._0_16_;
            auVar25 = vcmpps_avx(local_2a0,auVar25,2);
            auVar25 = vandps_avx(auVar25,local_2b0);
            auVar34 = auVar24 & auVar25;
            if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar34[0xf]) {
              return;
            }
            local_360 = vandps_avx(auVar25,auVar24);
            fVar1 = auVar16._0_4_;
            auVar20._0_4_ = auVar47._0_4_ * fVar1;
            fVar2 = auVar16._4_4_;
            auVar20._4_4_ = auVar47._4_4_ * fVar2;
            fVar3 = auVar16._8_4_;
            auVar20._8_4_ = auVar47._8_4_ * fVar3;
            fVar23 = auVar16._12_4_;
            auVar20._12_4_ = auVar47._12_4_ * fVar23;
            auVar27._0_4_ = auVar33._0_4_ * fVar1;
            auVar27._4_4_ = auVar33._4_4_ * fVar2;
            auVar27._8_4_ = auVar33._8_4_ * fVar3;
            auVar27._12_4_ = auVar33._12_4_ * fVar23;
            auVar37._0_4_ = auVar17._0_4_ * fVar1;
            auVar37._4_4_ = auVar17._4_4_ * fVar2;
            auVar37._8_4_ = auVar17._8_4_ * fVar3;
            auVar37._12_4_ = auVar17._12_4_ * fVar23;
            local_290 = vsubps_avx(auVar20,auVar35);
            local_280 = vsubps_avx(auVar27,auVar19);
            local_270 = vsubps_avx(auVar37,auVar45);
            pSVar12 = context->scene;
            auVar24 = vblendvps_avx(auVar48._0_16_,local_2a0,local_360);
            auVar19 = vshufps_avx(auVar24,auVar24,0xb1);
            auVar19 = vminps_avx(auVar19,auVar24);
            auVar45 = vshufpd_avx(auVar19,auVar19,1);
            auVar19 = vminps_avx(auVar45,auVar19);
            auVar19 = vcmpps_avx(auVar24,auVar19,0);
            auVar45 = local_360 & auVar19;
            auVar24 = local_360;
            if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar45[0xf] < '\0') {
              auVar24 = vandps_avx(auVar19,local_360);
            }
            uVar8 = vmovmskps_avx(auVar24);
            lVar13 = 0;
            if (CONCAT44(uVar9,uVar8) != 0) {
              for (; (CONCAT44(uVar9,uVar8) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            auVar24 = ZEXT816(0) << 0x40;
            auVar50 = ZEXT1664(auVar24);
            auVar28 = vcmpps_avx(ZEXT1632(auVar24),ZEXT1632(auVar24),0xf);
            auVar52 = ZEXT3264(auVar28);
            auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
            do {
              local_2c0 = &local_180;
              local_2e0 = local_340;
              uVar4 = *(uint *)(local_1b0 + lVar13 * 4);
              pRVar10 = (RayHitK<8> *)(ulong)uVar4;
              pGVar5 = (pSVar12->geometries).items[(long)pRVar10].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_360 + lVar13 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_290 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_280 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_270 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[lVar13];
                  *(uint *)(ray + k * 4 + 0x240) = uVar4;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                auStack_b0 = vpshufd_avx(ZEXT416(uVar4),0);
                local_e0 = (sphere->primIDs).field_0.i[lVar13];
                local_180._0_4_ = *(undefined4 *)(local_290 + lVar13 * 4);
                local_160 = *(undefined4 *)(local_280 + lVar13 * 4);
                uVar9 = *(undefined4 *)(local_270 + lVar13 * 4);
                local_140._4_4_ = uVar9;
                local_140._0_4_ = uVar9;
                local_140._8_4_ = uVar9;
                local_140._12_4_ = uVar9;
                local_140._16_4_ = uVar9;
                local_140._20_4_ = uVar9;
                local_140._24_4_ = uVar9;
                local_140._28_4_ = uVar9;
                local_180._4_4_ = local_180._0_4_;
                local_180._8_4_ = local_180._0_4_;
                local_180._12_4_ = local_180._0_4_;
                local_180._16_4_ = local_180._0_4_;
                local_180._20_4_ = local_180._0_4_;
                local_180._24_4_ = local_180._0_4_;
                local_180._28_4_ = local_180._0_4_;
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_100 = auVar50._0_32_;
                local_120 = auVar50._0_32_;
                uStack_dc = local_e0;
                uStack_d8 = local_e0;
                uStack_d4 = local_e0;
                uStack_d0 = local_e0;
                uStack_cc = local_e0;
                uStack_c8 = local_e0;
                uStack_c4 = local_e0;
                local_c0 = auStack_b0;
                local_1e0 = auVar52._0_32_;
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + lVar13 * 4);
                local_340 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar7 & 0xf) << 4));
                local_330 = *(undefined1 (*) [16])
                             (mm_lookupmask_ps + (long)((int)uVar7 >> 4) * 0x10);
                local_2d8 = pGVar5->userPtr;
                local_2d0 = context->user;
                local_2b8 = 8;
                pRVar10 = (RayHitK<8> *)pGVar5->intersectionFilterN;
                local_348 = sphere;
                local_2c8 = ray;
                if (pRVar10 != (RayHitK<8> *)0x0) {
                  local_300 = auVar42._0_16_;
                  local_310 = auVar44._0_16_;
                  local_2b0._0_8_ = pSVar12;
                  pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_2e0);
                  auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar52 = ZEXT3264(local_1e0);
                  auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar44 = ZEXT1664(local_310);
                  auVar42 = ZEXT1664(local_300);
                  pSVar12 = (Scene *)local_2b0._0_8_;
                }
                auVar24 = vpcmpeqd_avx(auVar53._0_16_,local_340);
                auVar19 = vpcmpeqd_avx(auVar53._0_16_,local_330);
                auVar29._16_16_ = auVar19;
                auVar29._0_16_ = auVar24;
                local_1e0 = auVar52._0_32_;
                auVar28 = local_1e0 & ~auVar29;
                if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar28 >> 0x7f,0) == '\0') &&
                      (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar28 >> 0xbf,0) == '\0') &&
                    (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar28[0x1f]) {
                  auVar15._0_4_ = auVar52._0_4_ ^ auVar24._0_4_;
                  auVar15._4_4_ = auVar52._4_4_ ^ auVar24._4_4_;
                  auVar15._8_4_ = auVar52._8_4_ ^ auVar24._8_4_;
                  auVar15._12_4_ = auVar52._12_4_ ^ auVar24._12_4_;
                  auVar15._16_4_ = auVar52._16_4_ ^ auVar19._0_4_;
                  auVar15._20_4_ = auVar52._20_4_ ^ auVar19._4_4_;
                  auVar15._24_4_ = auVar52._24_4_ ^ auVar19._8_4_;
                  auVar15._28_4_ = auVar52._28_4_ ^ auVar19._12_4_;
                  auVar48 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  sphere = local_348;
                }
                else {
                  pRVar10 = (RayHitK<8> *)context->args->filter;
                  if ((pRVar10 != (RayHitK<8> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    local_300 = auVar42._0_16_;
                    local_310 = auVar44._0_16_;
                    local_2b0._0_8_ = pSVar12;
                    pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_2e0);
                    auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar52 = ZEXT3264(local_1e0);
                    auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar44 = ZEXT1664(local_310);
                    auVar42 = ZEXT1664(local_300);
                    pSVar12 = (Scene *)local_2b0._0_8_;
                  }
                  auVar24 = vpcmpeqd_avx(auVar53._0_16_,local_340);
                  auVar19 = vpcmpeqd_avx(auVar53._0_16_,local_330);
                  auVar22._16_16_ = auVar19;
                  auVar22._0_16_ = auVar24;
                  auVar15._0_4_ = auVar52._0_4_ ^ auVar24._0_4_;
                  auVar15._4_4_ = auVar52._4_4_ ^ auVar24._4_4_;
                  auVar15._8_4_ = auVar52._8_4_ ^ auVar24._8_4_;
                  auVar15._12_4_ = auVar52._12_4_ ^ auVar24._12_4_;
                  auVar15._16_4_ = auVar52._16_4_ ^ auVar19._0_4_;
                  auVar15._20_4_ = auVar52._20_4_ ^ auVar19._4_4_;
                  auVar15._24_4_ = auVar52._24_4_ ^ auVar19._8_4_;
                  auVar15._28_4_ = auVar52._28_4_ ^ auVar19._12_4_;
                  auVar28 = auVar52._0_32_ & ~auVar22;
                  auVar48 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  sphere = local_348;
                  if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar28 >> 0x7f,0) != '\0') ||
                        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar28 >> 0xbf,0) != '\0') ||
                      (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar28[0x1f] < '\0') {
                    auVar28 = vmaskmovps_avx(auVar15,*local_2c0);
                    *(undefined1 (*) [32])(local_2c8 + 0x180) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar15,local_2c0[1]);
                    *(undefined1 (*) [32])(local_2c8 + 0x1a0) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar15,local_2c0[2]);
                    *(undefined1 (*) [32])(local_2c8 + 0x1c0) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar15,local_2c0[3]);
                    *(undefined1 (*) [32])(local_2c8 + 0x1e0) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar15,local_2c0[4]);
                    *(undefined1 (*) [32])(local_2c8 + 0x200) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar15,local_2c0[5]);
                    *(undefined1 (*) [32])(local_2c8 + 0x220) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar15,local_2c0[6]);
                    *(undefined1 (*) [32])(local_2c8 + 0x240) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar15,local_2c0[7]);
                    *(undefined1 (*) [32])(local_2c8 + 0x260) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar15,local_2c0[8]);
                    *(undefined1 (*) [32])(local_2c8 + 0x280) = auVar28;
                    pRVar10 = local_2c8;
                  }
                }
                if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar15 >> 0x7f,0) == '\0') &&
                      (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar15 >> 0xbf,0) == '\0') &&
                    (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar15[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar44._0_4_;
                }
                else {
                  auVar44 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_360 + lVar13 * 4) = 0;
                auVar24 = vshufps_avx(auVar44._0_16_,auVar44._0_16_,0);
                auVar24 = vcmpps_avx(auVar42._0_16_,auVar24,2);
                local_360 = vandps_avx(auVar24,local_360);
              }
              if ((((local_360 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_360 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_360 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_360[0xf]) {
                return;
              }
              auVar24 = vblendvps_avx(auVar48._0_16_,auVar42._0_16_,local_360);
              auVar19 = vshufps_avx(auVar24,auVar24,0xb1);
              auVar19 = vminps_avx(auVar19,auVar24);
              auVar45 = vshufpd_avx(auVar19,auVar19,1);
              auVar19 = vminps_avx(auVar45,auVar19);
              auVar19 = vcmpps_avx(auVar24,auVar19,0);
              auVar45 = local_360 & auVar19;
              auVar24 = local_360;
              if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar45[0xf] < '\0') {
                auVar24 = vandps_avx(auVar19,local_360);
              }
              uVar9 = vmovmskps_avx(auVar24);
              uVar11 = CONCAT44((int)((ulong)pRVar10 >> 0x20),uVar9);
              lVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
            } while( true );
          }
          local_1f0 = auVar24;
          auStack_b0 = vpshufd_avx(ZEXT416(uVar4),0);
          local_e0 = (sphere->primIDs).field_0.i[lVar13];
          local_180._0_4_ = *(undefined4 *)(local_290 + lVar13 * 4);
          local_160 = *(undefined4 *)(local_280 + lVar13 * 4);
          local_140._4_4_ = *(undefined4 *)(local_270 + lVar13 * 4);
          local_180._4_4_ = local_180._0_4_;
          local_180._8_4_ = local_180._0_4_;
          local_180._12_4_ = local_180._0_4_;
          local_180._16_4_ = local_180._0_4_;
          local_180._20_4_ = local_180._0_4_;
          local_180._24_4_ = local_180._0_4_;
          local_180._28_4_ = local_180._0_4_;
          uStack_15c = local_160;
          uStack_158 = local_160;
          uStack_154 = local_160;
          uStack_150 = local_160;
          uStack_14c = local_160;
          uStack_148 = local_160;
          uStack_144 = local_160;
          local_140._0_4_ = local_140._4_4_;
          local_140._8_4_ = local_140._4_4_;
          local_140._12_4_ = local_140._4_4_;
          local_140._16_4_ = local_140._4_4_;
          local_140._20_4_ = local_140._4_4_;
          local_140._24_4_ = local_140._4_4_;
          local_140._28_4_ = local_140._4_4_;
          local_100 = auVar58._0_32_;
          local_120 = auVar58._0_32_;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + lVar13 * 4);
          local_340 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar7 & 0xf) << 4));
          local_330 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar7 >> 4) * 0x10);
          local_2d8 = pGVar5->userPtr;
          local_2d0 = context->user;
          local_2b8 = 8;
          pRVar10 = (RayHitK<8> *)pGVar5->intersectionFilterN;
          if (pRVar10 != (RayHitK<8> *)0x0) {
            local_300 = auVar42._0_16_;
            local_310 = auVar44._0_16_;
            local_348 = sphere;
            local_2e8 = pSVar12;
            local_260 = auVar16;
            local_250 = auVar45;
            local_240 = auVar19;
            local_230 = auVar35;
            local_220 = auVar17;
            local_210 = auVar33;
            local_200 = auVar47;
            pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_2e0);
            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar57 = ZEXT1664(local_260);
            auVar52 = ZEXT1664(local_250);
            auVar50 = ZEXT1664(local_240);
            auVar56 = ZEXT1664(local_230);
            auVar55 = ZEXT1664(local_220);
            auVar54 = ZEXT1664(local_210);
            auVar53 = ZEXT1664(local_200);
            auVar48 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar44 = ZEXT1664(local_310);
            auVar42 = ZEXT1664(local_300);
            sphere = local_348;
            pSVar12 = local_2e8;
          }
          auVar24 = vpcmpeqd_avx(local_340,ZEXT816(0) << 0x40);
          auVar19 = vpcmpeqd_avx(local_330,ZEXT816(0) << 0x40);
          auVar28._16_16_ = auVar19;
          auVar28._0_16_ = auVar24;
          auVar28 = local_1a0 & ~auVar28;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0x7f,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0xbf,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar28[0x1f]) {
            auVar14._0_4_ = auVar24._0_4_ ^ local_1a0._0_4_;
            auVar14._4_4_ = auVar24._4_4_ ^ local_1a0._4_4_;
            auVar14._8_4_ = auVar24._8_4_ ^ local_1a0._8_4_;
            auVar14._12_4_ = auVar24._12_4_ ^ local_1a0._12_4_;
            auVar14._16_4_ = auVar19._0_4_ ^ local_1a0._16_4_;
            auVar14._20_4_ = auVar19._4_4_ ^ local_1a0._20_4_;
            auVar14._24_4_ = auVar19._8_4_ ^ local_1a0._24_4_;
            auVar14._28_4_ = auVar19._12_4_ ^ local_1a0._28_4_;
            auVar39 = ZEXT1664(local_1f0);
          }
          else {
            pRVar10 = (RayHitK<8> *)context->args->filter;
            auVar39 = ZEXT1664(local_1f0);
            if ((pRVar10 != (RayHitK<8> *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              local_300 = auVar42._0_16_;
              local_310 = auVar44._0_16_;
              local_200 = auVar53._0_16_;
              local_210 = auVar54._0_16_;
              local_220 = auVar55._0_16_;
              local_230 = auVar56._0_16_;
              local_240 = auVar50._0_16_;
              local_250 = auVar52._0_16_;
              local_260 = auVar57._0_16_;
              local_2e8 = pSVar12;
              pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_2e0);
              auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar39 = ZEXT1664(local_1f0);
              auVar57 = ZEXT1664(local_260);
              auVar52 = ZEXT1664(local_250);
              auVar50 = ZEXT1664(local_240);
              auVar56 = ZEXT1664(local_230);
              auVar55 = ZEXT1664(local_220);
              auVar54 = ZEXT1664(local_210);
              auVar53 = ZEXT1664(local_200);
              auVar48 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar44 = ZEXT1664(local_310);
              auVar42 = ZEXT1664(local_300);
              pSVar12 = local_2e8;
            }
            auVar24 = vpcmpeqd_avx(local_340,ZEXT816(0) << 0x40);
            auVar19 = vpcmpeqd_avx(local_330,ZEXT816(0) << 0x40);
            auVar21._16_16_ = auVar19;
            auVar21._0_16_ = auVar24;
            auVar14._0_4_ = auVar24._0_4_ ^ local_1a0._0_4_;
            auVar14._4_4_ = auVar24._4_4_ ^ local_1a0._4_4_;
            auVar14._8_4_ = auVar24._8_4_ ^ local_1a0._8_4_;
            auVar14._12_4_ = auVar24._12_4_ ^ local_1a0._12_4_;
            auVar14._16_4_ = auVar19._0_4_ ^ local_1a0._16_4_;
            auVar14._20_4_ = auVar19._4_4_ ^ local_1a0._20_4_;
            auVar14._24_4_ = auVar19._8_4_ ^ local_1a0._24_4_;
            auVar14._28_4_ = auVar19._12_4_ ^ local_1a0._28_4_;
            auVar28 = local_1a0 & ~auVar21;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              auVar28 = vmaskmovps_avx(auVar14,*local_2c0);
              *(undefined1 (*) [32])(local_2c8 + 0x180) = auVar28;
              auVar28 = vmaskmovps_avx(auVar14,local_2c0[1]);
              *(undefined1 (*) [32])(local_2c8 + 0x1a0) = auVar28;
              auVar28 = vmaskmovps_avx(auVar14,local_2c0[2]);
              *(undefined1 (*) [32])(local_2c8 + 0x1c0) = auVar28;
              auVar28 = vmaskmovps_avx(auVar14,local_2c0[3]);
              *(undefined1 (*) [32])(local_2c8 + 0x1e0) = auVar28;
              auVar28 = vmaskmovps_avx(auVar14,local_2c0[4]);
              *(undefined1 (*) [32])(local_2c8 + 0x200) = auVar28;
              auVar28 = vmaskmovps_avx(auVar14,local_2c0[5]);
              *(undefined1 (*) [32])(local_2c8 + 0x220) = auVar28;
              auVar28 = vmaskmovps_avx(auVar14,local_2c0[6]);
              *(undefined1 (*) [32])(local_2c8 + 0x240) = auVar28;
              auVar28 = vmaskmovps_avx(auVar14,local_2c0[7]);
              *(undefined1 (*) [32])(local_2c8 + 0x260) = auVar28;
              auVar28 = vmaskmovps_avx(auVar14,local_2c0[8]);
              *(undefined1 (*) [32])(local_2c8 + 0x280) = auVar28;
              pRVar10 = local_2c8;
            }
          }
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar14 >> 0x7f,0) == '\0') &&
                (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar14 >> 0xbf,0) == '\0') &&
              (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar14[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = auVar44._0_4_;
          }
          else {
            auVar44 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_360 + lVar13 * 4) = 0;
          auVar24 = vshufps_avx(auVar44._0_16_,auVar44._0_16_,0);
          auVar24 = vcmpps_avx(local_1e0._0_16_,auVar24,2);
          local_360 = vandps_avx(auVar24,local_360);
        }
        uVar9 = (undefined4)((ulong)pRVar10 >> 0x20);
        auVar24 = auVar39._0_16_;
        auVar19 = auVar50._0_16_;
        auVar47 = auVar53._0_16_;
        auVar45 = auVar52._0_16_;
        auVar35 = auVar56._0_16_;
        auVar17 = auVar55._0_16_;
        auVar33 = auVar54._0_16_;
        auVar16 = auVar57._0_16_;
        if ((((local_360 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_360 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_360 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_360[0xf]) goto LAB_00dcc55e;
        auVar24 = vblendvps_avx(auVar48._0_16_,local_1e0._0_16_,local_360);
        auVar19 = vshufps_avx(auVar24,auVar24,0xb1);
        auVar19 = vminps_avx(auVar19,auVar24);
        auVar45 = vshufpd_avx(auVar19,auVar19,1);
        auVar19 = vminps_avx(auVar45,auVar19);
        auVar19 = vcmpps_avx(auVar24,auVar19,0);
        auVar45 = local_360 & auVar19;
        auVar24 = local_360;
        if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar45[0xf] < '\0') {
          auVar24 = vandps_avx(auVar19,local_360);
        }
        uVar8 = vmovmskps_avx(auVar24);
        lVar13 = 0;
        if (CONCAT44(uVar9,uVar8) != 0) {
          for (; (CONCAT44(uVar9,uVar8) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }